

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer_e2e_test.cpp
# Opt level: O0

void peer_udp_broadcast_discovery(void)

{
  MinimalisticThreadInterface **this;
  WaitResult<bool> WVar1;
  FindUserDataCallable local_1b8;
  undefined2 local_18c;
  undefined1 local_18a;
  allocator local_189;
  string local_188 [4];
  WaitResult<bool> find2;
  undefined1 local_168 [8];
  FindUserDataCallable find_peer1;
  bool bStack_113;
  allocator local_111;
  string local_110 [4];
  WaitResult<bool> find1;
  undefined1 local_f0 [8];
  FindUserDataCallable find_peer2;
  string local_c0 [32];
  undefined1 local_a0 [8];
  Peer peer2;
  allocator local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  Peer peer1;
  PeerParameters peer_parameters;
  
  this = &peer1.receiving_thread_;
  udpdiscovery::PeerParameters::PeerParameters((PeerParameters *)this);
  udpdiscovery::PeerParameters::set_can_discover((PeerParameters *)this,true);
  udpdiscovery::PeerParameters::set_can_be_discovered((PeerParameters *)this,true);
  udpdiscovery::PeerParameters::set_port((PeerParameters *)this,0x2ef5);
  udpdiscovery::PeerParameters::set_application_id((PeerParameters *)this,0x753584);
  udpdiscovery::PeerParameters::set_send_timeout_ms((PeerParameters *)this,100);
  udpdiscovery::Peer::Peer((Peer *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"peer 1",&local_71);
  udpdiscovery::Peer::Start
            ((Peer *)local_50,(PeerParameters *)&peer1.receiving_thread_,(string *)local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  udpdiscovery::impl::SleepFor(1000);
  udpdiscovery::Peer::Peer((Peer *)local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"peer 2",(allocator *)&find_peer2.field_0x27);
  udpdiscovery::Peer::Start
            ((Peer *)local_a0,(PeerParameters *)&peer1.receiving_thread_,(string *)local_c0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&find_peer2.field_0x27);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"peer 2",&local_111);
  FindUserDataCallable::FindUserDataCallable
            ((FindUserDataCallable *)local_f0,(Peer *)local_50,(string *)local_110);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  FindUserDataCallable::FindUserDataCallable
            ((FindUserDataCallable *)&find_peer1.field_0x20,(FindUserDataCallable *)local_f0);
  WVar1 = Wait<bool,FindUserDataCallable>(5000,200,(FindUserDataCallable *)&find_peer1.field_0x20);
  FindUserDataCallable::~FindUserDataCallable((FindUserDataCallable *)&find_peer1.field_0x20);
  if (((uint3)WVar1 & 1) != 0) {
    __assert_fail("find1.is_timeout == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                  ,0x7a,"void peer_udp_broadcast_discovery()");
  }
  bStack_113 = WVar1.has_result;
  if ((bStack_113 & 1U) != 1) {
    __assert_fail("find1.has_result == true",
                  "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                  ,0x7b,"void peer_udp_broadcast_discovery()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"peer 1",&local_189);
  FindUserDataCallable::FindUserDataCallable
            ((FindUserDataCallable *)local_168,(Peer *)local_a0,(string *)local_188);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  FindUserDataCallable::FindUserDataCallable(&local_1b8,(FindUserDataCallable *)local_168);
  WVar1 = Wait<bool,FindUserDataCallable>(5000,200,&local_1b8);
  local_18c = WVar1._0_2_;
  local_18a = WVar1.result;
  FindUserDataCallable::~FindUserDataCallable(&local_1b8);
  if ((local_18c & 1) != 0) {
    __assert_fail("find2.is_timeout == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                  ,0x81,"void peer_udp_broadcast_discovery()");
  }
  if ((local_18c._1_1_ & 1) == 1) {
    udpdiscovery::Peer::StopAndWaitForThreads((Peer *)local_50);
    udpdiscovery::Peer::StopAndWaitForThreads((Peer *)local_a0);
    FindUserDataCallable::~FindUserDataCallable((FindUserDataCallable *)local_168);
    FindUserDataCallable::~FindUserDataCallable((FindUserDataCallable *)local_f0);
    udpdiscovery::Peer::~Peer((Peer *)local_a0);
    udpdiscovery::Peer::~Peer((Peer *)local_50);
    return;
  }
  __assert_fail("find2.has_result == true",
                "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                ,0x82,"void peer_udp_broadcast_discovery()");
}

Assistant:

void peer_udp_broadcast_discovery() {
  udpdiscovery::PeerParameters peer_parameters;
  peer_parameters.set_can_discover(true);
  peer_parameters.set_can_be_discovered(true);
  peer_parameters.set_port(kPort);
  peer_parameters.set_application_id(kApplicationId);
  peer_parameters.set_send_timeout_ms(100);

  udpdiscovery::Peer peer1;
  peer1.Start(peer_parameters, "peer 1");

  // TODO: Understand why do we need this timeout.
  udpdiscovery::impl::SleepFor(1000);

  udpdiscovery::Peer peer2;
  peer2.Start(peer_parameters, "peer 2");

  FindUserDataCallable find_peer2(peer1, "peer 2");
  WaitResult<bool> find1 =
      Wait<bool>(/* timeout = */ 5000, /* sleep_timeout = */ 200,
                 /* callable= */ find_peer2);
  assert(find1.is_timeout == false);
  assert(find1.has_result == true);

  FindUserDataCallable find_peer1(peer2, "peer 1");
  WaitResult<bool> find2 =
      Wait<bool>(/* timeout = */ 5000, /* sleep_timeout = */ 200,
                 /* callable= */ find_peer1);
  assert(find2.is_timeout == false);
  assert(find2.has_result == true);

  peer1.StopAndWaitForThreads();
  peer2.StopAndWaitForThreads();
}